

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_config.cpp
# Opt level: O3

optional_ptr<duckdb::CompressionFunction,_true> __thiscall
duckdb::DBConfig::GetCompressionFunction
          (DBConfig *this,CompressionType type,PhysicalType physical_type)

{
  long lVar1;
  char cVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  type pCVar4;
  optional_ptr<duckdb::CompressionFunction,_true> oVar5;
  _Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
  *this_00;
  InternalException *this_01;
  undefined1 *puVar6;
  long lVar7;
  code *pcVar8;
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
  *this_02;
  CompressionFunction function;
  CompressionType local_1c9;
  pair<duckdb::PhysicalType,_duckdb::CompressionFunction> local_1c8;
  undefined1 local_f8 [200];
  
  this_02 = &this->compression_functions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
            ::operator->(this_02);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  pCVar4 = unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
           ::operator*(this_02);
  oVar5 = FindCompressionFunction(pCVar4,type,physical_type);
  if (oVar5.ptr == (CompressionFunction *)0x0) {
    pCVar4 = unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
             ::operator*(this_02);
    local_1c9 = type;
    if (type == COMPRESSION_CONSTANT) {
      puVar6 = internal_compression_methods;
      pcVar8 = ConstantFun::GetFunction;
    }
    else {
      lVar1 = 0;
      do {
        lVar7 = lVar1;
        if (lVar7 + 0x18 == 0x138) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_1c8._0_8_ = &local_1c8.second.init_analyze;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"Unsupported compression function type","");
          InternalException::InternalException(this_01,(string *)&local_1c8);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        lVar1 = lVar7 + 0x18;
      } while (internal_compression_methods[lVar7 + 0x18] != type);
      puVar6 = (undefined1 *)(lVar7 + 0x2435e48);
      pcVar8 = *(code **)(internal_compression_methods + lVar7 + 0x20);
    }
    cVar2 = (**(code **)(puVar6 + 0x10))(physical_type);
    if (cVar2 == '\0') {
      oVar5.ptr = (CompressionFunction *)0x0;
    }
    else {
      (*pcVar8)(local_f8,physical_type);
      this_00 = (_Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
                 *)::std::
                   map<duckdb::CompressionType,_std::map<duckdb::PhysicalType,_duckdb::CompressionFunction,_std::less<duckdb::PhysicalType>,_std::allocator<std::pair<const_duckdb::PhysicalType,_duckdb::CompressionFunction>_>_>,_std::less<duckdb::CompressionType>,_std::allocator<std::pair<const_duckdb::CompressionType,_std::map<duckdb::PhysicalType,_duckdb::CompressionFunction,_std::less<duckdb::PhysicalType>,_std::allocator<std::pair<const_duckdb::PhysicalType,_duckdb::CompressionFunction>_>_>_>_>_>
                   ::operator[](&pCVar4->functions,&local_1c9);
      local_1c8.first = physical_type;
      switchD_015de399::default((void *)((long)&local_1c8 + 8),local_f8,200);
      ::std::
      _Rb_tree<duckdb::PhysicalType,std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>,std::_Select1st<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>,std::less<duckdb::PhysicalType>,std::allocator<std::pair<duckdb::PhysicalType_const,duckdb::CompressionFunction>>>
      ::_M_emplace_unique<std::pair<duckdb::PhysicalType,duckdb::CompressionFunction>>
                (this_00,&local_1c8);
      oVar5 = FindCompressionFunction(pCVar4,local_1c9,physical_type);
    }
  }
  pthread_mutex_unlock(__mutex);
  return (optional_ptr<duckdb::CompressionFunction,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<CompressionFunction> DBConfig::GetCompressionFunction(CompressionType type,
                                                                   const PhysicalType physical_type) {
	lock_guard<mutex> l(compression_functions->lock);

	// Check if the function is already loaded into the global compression functions.
	auto function = FindCompressionFunction(*compression_functions, type, physical_type);
	if (function) {
		return function;
	}

	// We could not find the function in the global compression functions,
	// so we attempt loading it.
	return LoadCompressionFunction(*compression_functions, type, physical_type);
}